

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TabularDataFile.cpp
# Opt level: O1

bool __thiscall asl::TabularDataFile::nextRow(TabularDataFile *this)

{
  String *pSVar1;
  Array<asl::Var> *this_00;
  byte a;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  char b;
  anon_union_16_2_78e7fdac_for_String_2 *paVar6;
  ulong uVar7;
  int iVar8;
  anon_union_16_2_78e7fdac_for_String_2 *paVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  double dVar13;
  String value;
  String local_70;
  Var local_58;
  Array<asl::String> *local_48;
  int local_3c;
  anon_union_16_2_78e7fdac_for_String_2 *local_38;
  
  if ((((this->_file).super_File._file != (FILE *)0x0) || (bVar5 = readHeader(this), bVar5)) &&
     (bVar5 = TextFile::end(&this->_file), !bVar5)) {
    pSVar1 = &this->_currentLine;
    bVar5 = TextFile::readLine(&this->_file,pSVar1);
    if (bVar5) {
      if (((this->_dataStarted == false) && (2 < (this->_currentLine)._len)) &&
         (bVar5 = String::startsWith(pSVar1,anon_var_dwarf_9c0dc), bVar5)) {
        String::substr(&local_70,pSVar1,3,(this->_currentLine)._len);
        if (local_70._size == 0) {
          paVar9 = &local_70.field_2;
        }
        else {
          paVar9 = (anon_union_16_2_78e7fdac_for_String_2 *)
                   CONCAT71(local_70.field_2._1_7_,local_70.field_2._space[0]);
        }
        String::assign(pSVar1,paVar9->_space,local_70._len);
        if (local_70._size != 0) {
          free((void *)CONCAT71(local_70.field_2._1_7_,local_70.field_2._space[0]));
        }
      }
      local_48 = &this->_currentRowParts;
      Array<asl::String>::resize(local_48,0);
      if ((this->_currentLine)._size == 0) {
        paVar9 = &(this->_currentLine).field_2;
      }
      else {
        paVar9 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_currentLine).field_2._str;
      }
      local_70.field_2._space[0] = '\0';
      local_70._size = 0;
      local_70._len = 0;
      b = paVar9->_space[0];
      if (b != '\0') {
        iVar8 = 0;
        do {
          paVar9 = (anon_union_16_2_78e7fdac_for_String_2 *)(paVar9->_space + 1);
          if (iVar8 == 2) {
            if (b == '\"') {
LAB_0013cec5:
              iVar8 = 1;
              String::operator+=(&local_70,b);
            }
            else {
              iVar8 = 1;
              if (b == this->_separator) {
LAB_0013cf04:
                Array<asl::String>::insert(local_48,-1,&local_70);
                iVar8 = 0;
                String::assign(&local_70,"",0);
              }
            }
          }
          else if (iVar8 == 1) {
            iVar8 = 2;
            if (b != '\"') goto LAB_0013cec5;
          }
          else {
            iVar8 = 1;
            if (b != '\"') {
              if (b == this->_separator) goto LAB_0013cf04;
              iVar8 = 0;
              String::operator+=(&local_70,b);
            }
          }
          b = paVar9->_space[0];
        } while (b != '\0');
      }
      Array<asl::String>::insert(local_48,-1,&local_70);
      this_00 = &this->_row;
      Array<asl::Var>::resize(this_00,0);
      lVar10 = (long)*(int *)&(this->_currentRowParts)._a[-1].field_2;
      if (0 < lVar10) {
        a = this->_decimal;
        local_3c = (this->_types)._len;
        local_38 = &(this->_types).field_2;
        uVar7 = 0;
        uVar11 = lVar10 << 0x20;
        do {
          iVar8 = (int)uVar11;
          pSVar1 = local_48->_a + iVar8;
          paVar9 = &local_48->_a[iVar8].field_2;
          if ((int)uVar7 < local_3c) {
            paVar6 = local_38;
            if ((this->_types)._size != 0) {
              paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_types).field_2._str;
            }
            bVar2 = paVar6->_space[iVar8];
            if (0x6d < bVar2) {
              if (bVar2 == 0x73) {
                Var::Var(&local_58,pSVar1);
                Array<asl::Var>::insert(this_00,-1,&local_58);
              }
              else {
                if (bVar2 != 0x6e) goto LAB_0013d1d6;
                if (a != 0x2e) {
                  String::replaceme(pSVar1,a,'.');
                }
                if (pSVar1->_size != 0) {
                  paVar9 = (anon_union_16_2_78e7fdac_for_String_2 *)(pSVar1->field_2)._str;
                }
                dVar13 = myatof(paVar9->_space);
                Var::Var(&local_58,dVar13);
                Array<asl::Var>::insert(this_00,-1,&local_58);
              }
              goto LAB_0013d1ce;
            }
            if (bVar2 == 0x68) {
              if (pSVar1->_size != 0) {
                paVar9 = (anon_union_16_2_78e7fdac_for_String_2 *)(pSVar1->field_2)._str;
              }
              uVar7 = strtoul(paVar9->_space,(char **)0x0,0x10);
              Var::Var(&local_58,(uint)uVar7);
              Array<asl::Var>::insert(this_00,-1,&local_58);
              goto LAB_0013d1ce;
            }
            if (bVar2 == 0x69) {
              if (pSVar1->_size != 0) {
                paVar9 = (anon_union_16_2_78e7fdac_for_String_2 *)(pSVar1->field_2)._str;
              }
              local_58.field_1._i = myatoi(paVar9->_space);
              local_58._type = INT;
              Array<asl::Var>::insert(this_00,-1,&local_58);
              goto LAB_0013d1ce;
            }
          }
          else {
            paVar6 = paVar9;
            if (pSVar1->_size != 0) {
              paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)(pSVar1->field_2)._str;
            }
            uVar3 = pSVar1->_len;
            bVar2 = paVar6->_space[0];
            if (((byte)(bVar2 - 0x30) < 10) || (bVar2 == 0x2d || bVar2 == a)) {
              bVar5 = (int)uVar3 < 2;
              if (1 < (int)uVar3) {
                bVar5 = false;
                uVar7 = 2;
                do {
                  bVar2 = paVar6->_space[uVar7 - 1];
                  if (((((byte)(bVar2 - 0x3a) < 0xf6) && (bVar2 != 0x2b)) && (bVar2 != 0x2d)) &&
                     (bVar2 != a && (bVar2 & 0xdf) != 0x45)) break;
                  bVar5 = uVar3 <= uVar7;
                  bVar12 = uVar7 != uVar3;
                  uVar7 = uVar7 + 1;
                } while (bVar12);
              }
              if (bVar5) {
                if (a != 0x2e) {
                  String::replaceme(pSVar1,a,'.');
                }
                if (pSVar1->_size != 0) {
                  paVar9 = (anon_union_16_2_78e7fdac_for_String_2 *)(pSVar1->field_2)._str;
                }
                dVar13 = myatof(paVar9->_space);
                Var::Var(&local_58,dVar13);
                Array<asl::Var>::insert(this_00,-1,&local_58);
                goto LAB_0013d1ce;
              }
            }
            Var::Var(&local_58,pSVar1);
            Array<asl::Var>::insert(this_00,-1,&local_58);
LAB_0013d1ce:
            Var::~Var(&local_58);
          }
LAB_0013d1d6:
          uVar7 = uVar11 + 1;
          uVar4 = uVar11 >> 0x20;
          uVar11 = uVar11 & 0xffffffff00000000 | uVar7 & 0xffffffff;
        } while ((int)uVar7 < (int)uVar4);
      }
      this->_dataStarted = true;
      if (local_70._size != 0) {
        free((void *)CONCAT71(local_70.field_2._1_7_,local_70.field_2._space[0]));
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool TabularDataFile::nextRow()
{
	String& line = _currentLine;
	if(!_file)
	{
		if (!readHeader())
			return false;
	}
	if (_file.end() || !_file.readLine(line))
		return false;
	
	if (!_dataStarted && line.length() >= 3 && line.startsWith("\xef\xbb\xbf")) // eat BOM
		line = line.substr(3);
	
	Array<String>& row = _currentRowParts;

	row.clear();
	const char* p = line.data();
	char        c = ' ';
	State       state = BASE;
	String      value;
	while ((c = *p++))
	{
		switch (state)
		{
		case BASE:
			if (c == '"')
				state = QUOTE;
			else if (c == _separator)
			{
				row << value;
				value = "";
			}
			else
				value << c;
			break;
		case QUOTE:
			if (c != '"')
			{
				value << c;
			}
			else
				state = QUOTE2;
			break;
		case QUOTE2:
			if (c == '"')
			{
				value << c;
				state = QUOTE;
			}
			else if (c == _separator)
			{
				row << value;
				value = "";
				state = BASE;
			}
			else
				state = QUOTE;
			break;
		default:
			value << c;
		}
	}

	row << value;

	_row.clear();
	char decimal = _decimal;
	int ntypes = _types.length();
	
	foreach2(int i, String& v, row)
	{
		if(ntypes > i)
		{
			switch(_types[i])
			{
			case 'n':
				if (decimal != '.')
					v.replaceme(decimal, '.');
				_row << myatof(*v);
				break;
			case 's':
				_row << v;
				break;
			case 'i':
				_row << myatoi(*v);
				break;
			case 'h':
				_row << v.hexToInt();
				break;
			}
		}
		else
		{
			if (myisnumber(v, decimal))
			{
				if (decimal != '.')
					v.replaceme(decimal, '.');
					_row << myatof(*v);
			}
			else
				_row << v;
		}
	}
	_dataStarted = true;
	return true;
}